

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

void __thiscall cfd::js::api::json::XpubData::XpubData(XpubData *this)

{
  allocator local_25 [20];
  allocator local_11;
  XpubData *local_10;
  XpubData *this_local;
  
  local_10 = this;
  core::JsonClassBase<cfd::js::api::json::XpubData>::JsonClassBase
            (&this->super_JsonClassBase<cfd::js::api::json::XpubData>);
  (this->super_JsonClassBase<cfd::js::api::json::XpubData>)._vptr_JsonClassBase =
       (_func_int **)&PTR__XpubData_01b475b0;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ignore_items);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->base58_,"",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->hex_,"",local_25);
  std::allocator<char>::~allocator((allocator<char> *)local_25);
  CollectFieldName();
  return;
}

Assistant:

XpubData() {
    CollectFieldName();
  }